

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O0

void __thiscall QHttpNetworkRequest::setPeerVerifyName(QHttpNetworkRequest *this,QString *peerName)

{
  QHttpNetworkRequestPrivate *pQVar1;
  QSharedDataPointer<QHttpNetworkRequestPrivate> *in_RSI;
  
  pQVar1 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->(in_RSI);
  QString::operator=(&pQVar1->peerVerifyName,(QString *)in_RSI);
  return;
}

Assistant:

void QHttpNetworkRequest::setPeerVerifyName(const QString &peerName)
{
    d->peerVerifyName = peerName;
}